

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::NewKey
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          FString *key)

{
  bool bVar1;
  Node *this_00;
  FString local_60;
  FString local_58;
  Node *local_50;
  Node *n;
  Node *othern;
  FString local_30;
  Node *local_28;
  Node *mp;
  FString *key_local;
  TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this_local;
  
  mp = (Node *)key;
  key_local = (FString *)this;
  FString::FString(&local_30,key);
  this_00 = MainPosition(this,&local_30);
  FString::~FString(&local_30);
  local_28 = this_00;
  bVar1 = Node::IsNil(this_00);
  if (bVar1) {
    local_28->Next = (Node *)0x0;
  }
  else {
    local_50 = GetFreePos(this);
    if (local_50 == (Node *)0x0) {
      Rehash(this);
      FString::FString(&local_58,key);
      this_local = (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>
                    *)NewKey(this,&local_58);
      FString::~FString(&local_58);
      return (Node *)this_local;
    }
    FString::FString(&local_60,&(local_28->Pair).Key);
    n = MainPosition(this,&local_60);
    FString::~FString(&local_60);
    if (n == local_28) {
      local_50->Next = local_28->Next;
      local_28->Next = local_50;
      local_28 = local_50;
    }
    else {
      for (; n->Next != local_28; n = n->Next) {
      }
      n->Next = local_50;
      CopyNode(this,local_50,local_28);
      local_28->Next = (Node *)0x0;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  FString::FString(&(local_28->Pair).Key,key);
  return local_28;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}